

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchroniser.cpp
# Opt level: O3

void __thiscall
Synchroniser::decideWhichAndHowMuchInEach2extractFromSender
          (Synchroniser *this,wallet *sendersWallet,linkedList<myString> *btcId2extract_list,
          linkedList<int> *amountInEachBtc2extract_list,int amount2extract,
          linkedList<myString> *indexesList2remove)

{
  l_node<myString> *plVar1;
  int iVar2;
  int iVar3;
  linkedList<myString> *plVar4;
  linkedList<int> *plVar5;
  l_node<myString> *right;
  l_node<myString> *plVar6;
  l_node<int> *plVar7;
  linkedList<myString> local_c0;
  linkedList<myString> *local_a0;
  myString local_98;
  linkedList<int> local_80;
  myString local_60;
  myString local_48;
  
  local_a0 = indexesList2remove;
  wallet::getBtcIdsOwned_list(&local_c0,sendersWallet);
  iVar3 = local_c0.size;
  wallet::getAmountOnEachBtc(&local_80,sendersWallet);
  if (iVar3 == local_80.size) {
    local_80._vptr_linkedList = (_func_int **)&PTR__linkedList_0010ea78;
    if (local_80.head != (l_node<int> *)0x0 && iVar3 != 0) {
      do {
        plVar7 = (local_80.head)->next;
        operator_delete(local_80.head,0x10);
        local_80.head = plVar7;
      } while (plVar7 != (l_node<int> *)0x0);
    }
    local_c0._vptr_linkedList = (_func_int **)&PTR__linkedList_0010ea48;
    linkedList<myString>::clear(&local_c0);
    plVar4 = wallet::getBtcIdsOwned_listByRef(sendersWallet);
    right = plVar4->head;
    plVar5 = wallet::getAmountOnEachBtcByRef(sendersWallet);
    plVar7 = plVar5->head;
    iVar3 = plVar7->data;
    if (iVar3 < amount2extract) {
      do {
        myString::myString(&local_48,&right->data);
        linkedList<myString>::insert_last(btcId2extract_list,&local_48);
        myString::~myString(&local_48);
        linkedList<int>::insert_last(amountInEachBtc2extract_list,plVar7->data);
        iVar2 = wallet::getBalance(sendersWallet);
        wallet::setBalance(sendersWallet,iVar2 - plVar7->data);
        myString::myString(&local_60,&right->data);
        linkedList<myString>::insert_last(local_a0,&local_60);
        myString::~myString(&local_60);
        plVar7->data = 0;
        wallet::getBtcIdsOwned_list(&local_c0,sendersWallet);
        local_c0._vptr_linkedList = (_func_int **)&PTR__linkedList_0010ea48;
        linkedList<myString>::clear(&local_c0);
        right = right->next;
        wallet::getAmountOnEachBtc((linkedList<int> *)&local_c0,sendersWallet);
        local_c0._vptr_linkedList = (_func_int **)&PTR__linkedList_0010ea78;
        plVar6 = local_c0.head;
        if (local_c0.head != (l_node<myString> *)0x0 && local_c0.size != 0) {
          do {
            plVar1 = (l_node<myString> *)(plVar6->data).myStr;
            operator_delete(plVar6,0x10);
            plVar6 = plVar1;
          } while (plVar1 != (l_node<myString> *)0x0);
        }
        amount2extract = amount2extract - iVar3;
        plVar7 = plVar7->next;
        iVar3 = plVar7->data;
      } while (iVar3 < amount2extract);
    }
    myString::myString(&local_98,&right->data);
    linkedList<myString>::insert_last(btcId2extract_list,&local_98);
    myString::~myString(&local_98);
    linkedList<int>::insert_last(amountInEachBtc2extract_list,amount2extract);
    plVar7->data = plVar7->data - amount2extract;
    iVar3 = wallet::getBalance(sendersWallet);
    wallet::setBalance(sendersWallet,iVar3 - amount2extract);
    return;
  }
  __assert_fail("sendersWallet->getBtcIdsOwned_list().getSize() == sendersWallet->getAmountOnEachBtc().getSize()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/DimitrisGan[P]transactionBitCoinSystem/synchroniser.cpp"
                ,0x5b,
                "void Synchroniser::decideWhichAndHowMuchInEach2extractFromSender(wallet *, linkedList<myString> &, linkedList<int> &, int, linkedList<myString> &)"
               );
}

Assistant:

void Synchroniser::decideWhichAndHowMuchInEach2extractFromSender(wallet *sendersWallet,
                                                                 linkedList<myString> &btcId2extract_list,
                                                                 linkedList<int> &amountInEachBtc2extract_list,
                                                                 int amount2extract,
                                                                 linkedList<myString> &indexesList2remove) {

    int amountRemain2gather =amount2extract;

    linkedList<myString>::Iterator  ItA;
    linkedList<int>::Iterator  ItB;

    assert(sendersWallet->getBtcIdsOwned_list().getSize() == sendersWallet->getAmountOnEachBtc().getSize());



    ItA = sendersWallet->getBtcIdsOwned_listByRef().begin();
    ItB = sendersWallet->getAmountOnEachBtcByRef().begin();
    /*
     * ItA = btcId name
     * ItB = amount owned of the current btc
     **/
    int index =0; //maybe is needed to deleteByIndex if a btc to senders wallet reached zero
    while(true) //iterate simultaneously the 2 lists
    {

        //do stuff with ItA and ItB

        if (*ItB >= amountRemain2gather){ //means that the percentage amount of this btc is bigger than the remain2extract
            btcId2extract_list.insert_last(*ItA);
            amountInEachBtc2extract_list.insert_last(amountRemain2gather);

            *ItB = *ItB - amountRemain2gather; //reduce the amount from the owner(=sender) wallet
            sendersWallet->setBalance(sendersWallet->getBalance() - amountRemain2gather); //update the new total baalnce
            amountRemain2gather=0;

            break;

        }
        else { //means that the wallet will give all his onwership to this btc
            amountRemain2gather -= *ItB;

            btcId2extract_list.insert_last(*ItA); //add btcId in exchange list
            amountInEachBtc2extract_list.insert_last(*ItB);
            sendersWallet->setBalance(sendersWallet->getBalance() - *ItB); //update the new total baalnce

            indexesList2remove.insert_last(*ItA);
            *ItB = 0; //the wallet(=sender) is not owner of this btc anymore

        }


        index++;

        if(ItA != sendersWallet->getBtcIdsOwned_list().end())
        {
            ++ItA;
        }
        if(ItB != sendersWallet->getAmountOnEachBtc().end())
        {
            ++ItB;
        }
//        if(ItA == sendersWallet->getBtcIdsOwned_list().end() && ItB == sendersWallet->getAmountOnEachBtc().end())
//        {
//            break;
//        }
    }
}